

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

vec3 __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::getData_vec3
          (GLAttributeBuffer *this,size_t ind)

{
  undefined8 uVar1;
  vec3 vVar2;
  RenderDataType RVar3;
  string *in_RSI;
  AttributeBuffer *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 auVar4 [64];
  vec<3,_float,_(glm::qualifier)0> vVar6;
  allocator local_41;
  string local_40 [24];
  size_t in_stack_ffffffffffffffd8;
  undefined1 auVar5 [56];
  
  auVar5 = in_ZMM0._8_56_;
  RVar3 = AttributeBuffer::getType(in_RDI);
  if (RVar3 != Vector3Float) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"bad getData type",&local_41);
    exception(in_RSI);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    auVar5 = extraout_var;
  }
  vVar6 = getData_helper<glm::vec<3,float,(glm::qualifier)0>>
                    ((GLAttributeBuffer *)in_RSI,in_stack_ffffffffffffffd8);
  auVar4._0_8_ = vVar6._0_8_;
  auVar4._8_56_ = auVar5;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  vVar2.field_2 = vVar6.field_2;
  vVar2.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
  vVar2.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar1 >> 0x20);
  return vVar2;
}

Assistant:

glm::vec3 GLAttributeBuffer::getData_vec3(size_t ind) {
  if (getType() != RenderDataType::Vector3Float) exception("bad getData type");
  return getData_helper<glm::vec3>(ind);
}